

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void fmt::v11::detail::value<fmt::v11::context>::
     format_custom<Chunk,fmt::v11::formatter<Chunk,char,void>>
               (void *arg,parse_context<char> *parse_ctx,context *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  native_formatter<fmt::v11::basic_string_view<char>,_char,_(fmt::v11::detail::type)13> local_50;
  
  local_50.specs_.precision_ref.name.size_ = 0;
  local_50.specs_.width_ref.name.data_ = (char *)0x0;
  local_50.specs_.width_ref.name.size_ = 0;
  local_50.specs_.super_format_specs.super_basic_specs.data_ = 0x8000;
  local_50.specs_.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
  local_50.specs_.super_format_specs._5_4_ = 0;
  local_50.specs_.super_format_specs._9_7_ = 0xffffffff000000;
  local_50.specs_.precision_ref.name.data_ = (char *)0x0;
  pcVar3 = native_formatter<fmt::v11::basic_string_view<char>,_char,_(fmt::v11::detail::type)13>::
           parse(&local_50,parse_ctx);
  pcVar2 = (parse_ctx->fmt_).data_;
  (parse_ctx->fmt_).data_ = pcVar3;
  psVar1 = &(parse_ctx->fmt_).size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  basic_ostream_formatter<char>::format<Chunk,fmt::v11::context>
            ((basic_ostream_formatter<char> *)&local_50,(Chunk *)arg,ctx);
  return;
}

Assistant:

static void format_custom(void* arg, parse_context<char_type>& parse_ctx,
                            Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_formatter<const T, char_type>(), const T, T>;
    // format must be const for compatibility with std::format and compilation.
    const auto& cf = f;
    ctx.advance_to(cf.format(*static_cast<qualified_type*>(arg), ctx));
  }